

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

BOOL __thiscall GlobOptBlockData::IsArgumentsOpnd(GlobOptBlockData *this,Opnd *opnd)

{
  Sym *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  SymOpnd *pSVar4;
  PropertySym *pPVar5;
  IndirOpnd *pIVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  undefined4 *puVar9;
  bool local_52;
  bool local_51;
  RegOpnd *baseOpnd;
  RegOpnd *indexOpnd;
  PropertySym *propertySym;
  Sym *sym;
  SymID id;
  Opnd *opnd_local;
  GlobOptBlockData *this_local;
  
  bVar2 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar2) {
    pRVar7 = IR::Opnd::AsRegOpnd(opnd);
    this_local._4_4_ = IsArgumentsSymID(this,(pRVar7->m_sym->super_Sym).m_id);
  }
  else {
    bVar2 = IR::Opnd::IsSymOpnd(opnd);
    if (bVar2) {
      pSVar4 = IR::Opnd::AsSymOpnd(opnd);
      this_00 = pSVar4->m_sym;
      if ((this_00 == (Sym *)0x0) || (bVar2 = Sym::IsPropertySym(this_00), !bVar2)) {
        this_local._4_4_ = 0;
      }
      else {
        pPVar5 = Sym::AsPropertySym(this_00);
        this_local._4_4_ = IsArgumentsSymID(this,(pPVar5->m_stackSym->super_Sym).m_id);
      }
    }
    else {
      bVar2 = IR::Opnd::IsIndirOpnd(opnd);
      if (bVar2) {
        pIVar6 = IR::Opnd::AsIndirOpnd(opnd);
        pRVar7 = IR::IndirOpnd::GetIndexOpnd(pIVar6);
        pIVar6 = IR::Opnd::AsIndirOpnd(opnd);
        pRVar8 = IR::IndirOpnd::GetBaseOpnd(pIVar6);
        BVar3 = IsArgumentsSymID(this,(pRVar8->m_sym->super_Sym).m_id);
        local_51 = true;
        if (BVar3 == 0) {
          local_52 = false;
          if (pRVar7 != (RegOpnd *)0x0) {
            BVar3 = IsArgumentsSymID(this,(pRVar7->m_sym->super_Sym).m_id);
            local_52 = BVar3 != 0;
          }
          local_51 = local_52;
        }
        this_local._4_4_ = (uint)local_51;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                           ,0x501,"(false)","Unknown type");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL
GlobOptBlockData::IsArgumentsOpnd(IR::Opnd const* opnd) const
{
    SymID id = 0;
    if (opnd->IsRegOpnd())
    {
        id = opnd->AsRegOpnd()->m_sym->m_id;
        return this->IsArgumentsSymID(id);
    }
    else if (opnd->IsSymOpnd())
    {
        Sym const *sym = opnd->AsSymOpnd()->m_sym;
        if (sym && sym->IsPropertySym())
        {
            PropertySym const *propertySym = sym->AsPropertySym();
            id = propertySym->m_stackSym->m_id;
            return this->IsArgumentsSymID(id);
        }
        return false;
    }
    else if (opnd->IsIndirOpnd())
    {
        IR::RegOpnd const *indexOpnd = opnd->AsIndirOpnd()->GetIndexOpnd();
        IR::RegOpnd const *baseOpnd = opnd->AsIndirOpnd()->GetBaseOpnd();
        return this->IsArgumentsSymID(baseOpnd->m_sym->m_id) || (indexOpnd && this->IsArgumentsSymID(indexOpnd->m_sym->m_id));
    }
    AssertMsg(false, "Unknown type");
    return false;
}